

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O3

void __thiscall
mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::section_timer_impl
          (section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this,
          ostream *outstream,MPI_Comm comm,int root)

{
  rep_conflict rVar1;
  
  this->_vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001509a8;
  this->ostr = outstream;
  this->comm = comm;
  this->root = root;
  (this->sep)._M_dataplus._M_p = (pointer)&(this->sep).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sep,"\t","");
  (this->start).__d.__r = 0;
  MPI_Barrier(comm);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start).__d.__r = rVar1;
  section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
       section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + 1;
  return;
}

Assistant:

section_timer_impl(std::ostream& outstream = std::cerr, MPI_Comm comm = MPI_COMM_WORLD, int root = 0)
      : ostr(outstream), comm(comm), root(root), sep("\t") {
        // sync on barrier
        MPI_Barrier(comm);
        start = std::chrono::steady_clock::now();
        section_timer_impl::depth++;
    }